

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O2

void update_mon_intrinsics(level *lev,monst *mon,obj *obj,boolean on,boolean silently)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  char *str;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  obj *otmp;
  bool bVar9;
  bool bVar10;
  ulong uStack_70;
  
  if (obj->oclass == '\x02') {
    bVar9 = false;
  }
  else if (obj->oclass == '\x06') {
    bVar9 = objects[obj->otyp].oc_subtyp == '\0';
  }
  else {
    bVar9 = true;
  }
  bVar1 = objects[obj->otyp].oc_oprop;
  uVar7 = obj->oprops;
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00276767;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00276762;
      }
      else {
LAB_00276762:
        if (ublindf == (obj *)0x0) goto LAB_0027671d;
LAB_00276767:
        bVar8 = 1;
        if (ublindf->oartifact != '\x1d') goto LAB_00276829;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (bVar8 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
          (bVar8 = 1, (viz_array[mon->my][mon->mx] & 1U) == 0)) ||
         ((mon->data->mflags3 & 0x200) == 0)) goto LAB_00276829;
    }
  }
  else {
    bVar2 = worm_known(lev,mon);
    if (bVar2 == '\0') {
LAB_0027671d:
      bVar8 = 1;
      goto LAB_00276829;
    }
  }
  uVar6 = *(uint *)&mon->field_0x60;
  if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    bVar8 = 1;
    if ((char)uVar6 < '\0') goto LAB_00276829;
  }
  else {
    bVar8 = 1;
    if (((char)uVar6 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_00276829;
  }
  bVar8 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar6 >> 9) & 1;
LAB_00276829:
  if ((((ushort)(obj->otyp - 0x54U) < 0x16) &&
      (obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr != (char *)0x0)) &&
     (iVar3 = strncmp(obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr,"gold ",5),
     iVar3 == 0)) {
    if (on == '\0') {
      end_burn(obj,'\0');
    }
    else {
      begin_burn(lev,obj,'\0');
      if ((silently == '\0') && (bVar8 == 0)) {
        str = xname(obj);
        The(str);
        pline("%s begins to glow.");
      }
    }
  }
  uVar6 = 0;
  uVar4 = 0;
  uStack_70 = (ulong)bVar1;
  if (bVar1 == 0) goto LAB_00276a6c;
  do {
    uVar4 = uStack_70;
    bVar2 = in_mklev;
    uVar5 = (uint)uVar4;
    if (on == '\0') {
      if (uVar5 - 1 < 8) {
        in_mklev = bVar2;
        if ((mon->data->mresists >> (uVar5 - 1 & 0x1f) & 1) == 0) {
          otmp = (obj *)&mon->minvent;
          do {
            otmp = otmp->nobj;
            if (otmp == (obj *)0x0) {
              mon->mintrinsics =
                   mon->mintrinsics & (~(ushort)(1 << ((byte)(uVar5 - 1) & 0x1f)) | 0xff00);
              break;
            }
          } while ((otmp->owornmask == 0) || (bVar2 = obj_has_prop(otmp,uVar5), bVar2 == '\0'));
        }
      }
      else if (uVar5 == 0x1a) {
LAB_002769dc:
        if (silently != '\0') {
          in_mklev = '\x01';
        }
        mon_adjust_speed(mon,0,obj);
        uVar4 = 0x1a;
        in_mklev = bVar2;
      }
      else {
        in_mklev = bVar2;
        if (uVar5 == 0xd) {
          uVar5 = *(uint *)&mon->field_0x60 & 0xfffffffd | *(uint *)&mon->field_0x60 >> 2 & 2;
          goto LAB_00276a4d;
        }
      }
    }
    else if (uVar5 < 0x2f) {
      in_mklev = bVar2;
      if ((0x74e0024c0000U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0xd) {
          if (uVar4 == 0x1a) goto LAB_002769dc;
          goto LAB_00276914;
        }
        uVar5 = (*(uint *)&mon->field_0x60 & 0xfffffffd | *(uint *)&mon->field_0x60 >> 1 & 2) ^ 2;
LAB_00276a4d:
        *(uint *)&mon->field_0x60 = uVar5;
        uVar4 = 0xd;
      }
    }
    else {
LAB_00276914:
      in_mklev = bVar2;
      if (uVar5 < 9) {
        mon->mintrinsics = mon->mintrinsics | (ushort)(1 << ((char)uVar4 - 1U & 0x1f)) & 0xff;
      }
    }
LAB_00276a6c:
    if (obj->otyp == 0x7c) {
      uVar5 = 0;
      if (on == '\0') {
        uVar5 = *(uint *)&mon->field_0x60 >> 2 & 2;
      }
      *(uint *)&mon->field_0x60 =
           uVar5 | (*(uint *)&mon->field_0x60 & 0xfffffff9) + (uint)(on != '\0') * 4;
    }
    do {
      uVar5 = (uint)uVar4;
      if (uVar7 == 0) {
LAB_00276b6a:
        if (((on == '\0') && (u.usteed == mon)) && (obj->otyp == 0xf0)) {
          dismount_steed(1);
        }
        if (silently != '\0') {
          return;
        }
        if (mon->wormno == '\0') {
          if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_00276c63;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00276c02;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00276bf9;
          }
          else {
LAB_00276bf9:
            if (ublindf == (obj *)0x0) goto LAB_00276cb8;
LAB_00276c02:
            if (ublindf->oartifact != '\x1d') goto LAB_00276cb8;
          }
          if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) {
            uVar6 = 1;
            if (((viz_array[mon->my][mon->mx] & 1U) == 0) || ((mon->data->mflags3 & 0x200) == 0))
            goto LAB_00276cbb;
            goto LAB_00276c63;
          }
        }
        else {
          bVar2 = worm_known(lev,mon);
          if (bVar2 != '\0') {
LAB_00276c63:
            uVar5 = *(uint *)&mon->field_0x60;
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((char)uVar5 < '\0') goto LAB_00276cb8;
            }
            else {
              uVar6 = 1;
              if (((char)uVar5 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
              goto LAB_00276cbb;
            }
            uVar6 = 1;
            if ((uVar5 >> 9 & 1) == 0) {
              uVar6 = (uint)u._1052_4_ >> 5 & 1;
            }
            goto LAB_00276cbb;
          }
        }
LAB_00276cb8:
        uVar6 = 1;
LAB_00276cbb:
        if (uVar6 == bVar8) {
          return;
        }
        newsym((int)mon->mx,(int)mon->my);
        return;
      }
      do {
        bVar10 = uVar6 == 0;
        uVar6 = uVar6 * 2;
        if (bVar10) {
          uVar6 = 1;
        }
        if (0xfffff < (int)uVar6) goto LAB_00276b6a;
      } while ((uVar7 & (long)(int)uVar6) == 0);
      uVar7 = uVar7 & (long)(int)~uVar6;
      if (uVar6 == 1) {
        if (bVar9) {
          uStack_70 = 1;
          uVar6 = 1;
          break;
        }
      }
      else if (uVar6 == 2) {
        if (bVar9) {
          uStack_70 = 2;
          uVar6 = 2;
          break;
        }
      }
      else if (uVar6 == 4) {
        if (bVar9) {
          uStack_70 = 0x35;
          uVar6 = 4;
          break;
        }
      }
      else {
        if (uVar6 == 0x10) {
          uStack_70 = 0x2a;
          break;
        }
        if (uVar6 == 0x20) {
          uStack_70 = 0x1a;
          break;
        }
        if (uVar6 == 0x400) {
          uStack_70 = 0x19;
          break;
        }
        if (uVar6 == 0x800) {
          uStack_70 = 0x2d;
          break;
        }
        if (uVar6 == 0x8000) {
          uStack_70 = 0x25;
          break;
        }
        uVar5 = 0;
        if (uVar6 == 0x80000) {
          uStack_70 = 0x14;
          break;
        }
      }
      uVar4 = 0;
      uStack_70 = (ulong)uVar5;
    } while (uVar5 == 0);
  } while( true );
}

Assistant:

void update_mon_intrinsics(struct level *lev, struct monst *mon, struct obj *obj,
			   boolean on, boolean silently)
{
    int unseen;
    uchar mask;
    struct obj *otmp;
    int which = (int) objects[obj->otyp].oc_oprop;
    long props = obj->oprops;
    int p = 0;
    boolean is_weapon = (obj->oclass == WEAPON_CLASS || is_weptool(obj));

    unseen = !canseemon(lev, mon);

    if (Is_gold_dragon_armor(obj->otyp)) {
	if (on)
	    begin_burn(lev, obj, FALSE);
	else
	    end_burn(obj, FALSE);
	if (!unseen && !silently)
	    if (on) pline("%s begins to glow.", The(xname(obj)));
    }

    if (!which) goto maybe_blocks;

 new_property:

    if (on) {
	switch (which) {
	 case INVIS:
	    mon->minvis = !mon->invis_blkd;
	    break;
	 case FAST:
	  {
	    boolean save_in_mklev = in_mklev;
	    if (silently) in_mklev = TRUE;
	    mon_adjust_speed(mon, 0, obj);
	    in_mklev = save_in_mklev;
	    break;
	  }
	/* properties handled elsewhere */
	 case ANTIMAGIC:
	 case REFLECTING:
	    break;
	/* properties which have no effect for monsters */
	 case CLAIRVOYANT:
	 case STEALTH:
	 case TELEPAT:
	    break;
	/* properties which should have an effect but aren't implemented */
	 case LEVITATION:
	 case WWALKING:
	    break;
	/* properties which maybe should have an effect but don't */
	 case DISPLACED:
	 case FUMBLING:
	 case JUMPING:
	 case PROTECTION:
	    break;
	 default:
	    if (which <= 8) {	/* 1 thru 8 correspond to MR_xxx mask values */
		/* FIRE,COLD,SLEEP,DISINT,SHOCK,POISON,ACID,STONE */
		mask = (uchar) (1 << (which - 1));
		mon->mintrinsics |= (unsigned short) mask;
	    }
	    break;
	}
    } else {	    /* off */
	switch (which) {
	 case INVIS:
	    mon->minvis = mon->perminvis;
	    break;
	 case FAST:
	  {
	    boolean save_in_mklev = in_mklev;
	    if (silently) in_mklev = TRUE;
	    mon_adjust_speed(mon, 0, obj);
	    in_mklev = save_in_mklev;
	    break;
	  }
	 case FIRE_RES:
	 case COLD_RES:
	 case SLEEP_RES:
	 case DISINT_RES:
	 case SHOCK_RES:
	 case POISON_RES:
	 case ACID_RES:
	 case STONE_RES:
	    mask = (uchar) (1 << (which - 1));
	    /* If the monster doesn't have this resistance intrinsically,
	       check whether any other worn item confers it.  Note that
	       we don't currently check for anything conferred via simply
	       carrying an object. */
	    if (!(mon->data->mresists & mask)) {
		for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
		    if (otmp->owornmask && obj_has_prop(otmp, which))
			break;
		if (!otmp)
		    mon->mintrinsics &= ~((unsigned short) mask);
	    }
	    break;
	 default:
	    break;
	}
    }

 maybe_blocks:
    /* obj->owornmask has been cleared by this point, so we can't use it.
       However, since monsters don't wield armor, we don't have to guard
       against that and can get away with a blanket worn-mask value. */
    switch (w_blocks(obj,~0L)) {
     case INVIS:
	mon->invis_blkd = on ? 1 : 0;
	mon->minvis = on ? 0 : mon->perminvis;
	break;
     default:
	break;
    }

    /* Repeat most of the above (goto new_property) for each property. */
    while (props) {
	if (p == 0) p = 1;
	else p <<= 1;

	if (p > ITEM_PROP_MASK) break;
	if (!(props & p)) continue;

	props &= ~p;

	switch (p) {
	case ITEM_FIRE:
	    if (!is_weapon) which = FIRE_RES;
	    break;
	case ITEM_FROST:
	    if (!is_weapon) which = COLD_RES;
	    break;
	case ITEM_DRLI:
	    if (!is_weapon) which = DRAIN_RES;
	    break;
	case ITEM_REFLECTION:	which = REFLECTING; break;
	case ITEM_SPEED:	which = FAST; break;
	case ITEM_ESP:		which = TELEPAT; break;
	case ITEM_DISPLACEMENT:	which = DISPLACED; break;
	case ITEM_FUMBLING:	which = FUMBLING; break;
	case ITEM_AGGRAVATE:	which = AGGRAVATE_MONSTER; break;
	default:		which = 0; break;
	}

	if (which) goto new_property;
    }

	if (!on && mon == u.usteed && obj->otyp == SADDLE)
	    dismount_steed(DISMOUNT_FELL);

    /* if couldn't see it but now can, or vice versa, update display */
    if (!silently && (unseen ^ !canseemon(lev, mon)))
	newsym(mon->mx, mon->my);
}